

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::CountDriversFunc::checkArguments
          (CountDriversFunc *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  Symbol *pSVar3;
  long lVar4;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,1,6);
  lVar4 = 400;
  if (bVar2) {
    pSVar3 = Expression::getSymbolReference(*args->_M_ptr,false);
    if ((pSVar3 == (Symbol *)0x0) || (lVar4 = 0x148, pSVar3->kind != Net)) {
      ASTContext::addDiag(context,(DiagCode)0xc000b,(*args->_M_ptr)->sourceRange);
      lVar4 = 0x148;
    }
  }
  return *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar4);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 6))
            return comp.getErrorType();

        auto sym = args[0]->getSymbolReference(/* allowPacked */ false);
        if (!sym || sym->kind != SymbolKind::Net)
            context.addDiag(diag::ExpectedNetRef, args[0]->sourceRange);

        return comp.getBitType();
    }